

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

int AF__FTranslatedLineTarget_TraceBleed
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int damage_00;
  FTranslatedLineTarget *t;
  bool bVar1;
  bool local_59;
  AActor *local_58;
  AActor *missile;
  int damage;
  FTranslatedLineTarget *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12b0,
                  "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param->field_0).field_3.Type != '\x03') {
    __assert_fail("param[paramnum].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12b0,
                  "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  t = (FTranslatedLineTarget *)(param->field_0).field_1.a;
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12b1,
                  "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12b1,
                  "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  damage_00 = param[1].field_0.i;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12b2,
                  "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if ((param[2].field_0.field_3.Type == '\x03') &&
     (bVar1 = true, param[2].field_0.field_1.atag != 1)) {
    bVar1 = param[2].field_0.field_1.a == (void *)0x0;
  }
  if (bVar1) {
    if (param[2].field_0.field_1.a == (void *)0x0) {
      NullParam("\"missile\"");
      local_58 = (AActor *)param[2].field_0.field_1.a;
    }
    else {
      local_58 = (AActor *)param[2].field_0.field_1.a;
    }
    local_59 = true;
    if (local_58 != (AActor *)0x0) {
      local_59 = DObject::IsKindOf((DObject *)local_58,AActor::RegistrationInfo.MyClass);
    }
    if (local_59 != false) {
      P_TraceBleed(damage_00,t,local_58);
      return 0;
    }
    __assert_fail("missile == NULL || missile->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12b2,
                  "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                ,0x12b2,
                "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(_FTranslatedLineTarget, TraceBleed)
{
	PARAM_SELF_STRUCT_PROLOGUE(FTranslatedLineTarget);
	PARAM_INT(damage);
	PARAM_OBJECT_NOT_NULL(missile, AActor);

	P_TraceBleed(damage, self, missile);
	return 0;
}